

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FiniteModel.cpp
# Opt level: O3

void __thiscall FMB::FiniteModel::FiniteModel(FiniteModel *this,uint size)

{
  int iVar1;
  ulong uVar2;
  double dVar3;
  long lVar4;
  uint uVar5;
  ulong uVar6;
  long lVar7;
  
  this->_size = size;
  this->_isPartial = false;
  (this->_functionCoverage)._timestamp = 1;
  (this->_functionCoverage)._size = 0;
  (this->_functionCoverage)._deleted = 0;
  (this->_functionCoverage)._capacityIndex = 0;
  (this->_functionCoverage)._capacity = 0;
  *(undefined8 *)&(this->_functionCoverage)._nextExpansionOccupancy = 0;
  *(undefined8 *)((long)&(this->_functionCoverage)._entries + 4) = 0;
  *(undefined8 *)((long)&(this->_functionCoverage)._afterLast + 4) = 0x100000000;
  memset(&(this->_predicateCoverage)._size,0,0x84);
  (this->_domainConstants)._timestamp = 1;
  (this->_domainConstants)._size = 0;
  (this->_domainConstants)._deleted = 0;
  (this->_domainConstants)._capacityIndex = 0;
  (this->_domainConstants)._capacity = 0;
  *(undefined8 *)&(this->_domainConstants)._nextExpansionOccupancy = 0;
  *(undefined8 *)((long)&(this->_domainConstants)._entries + 4) = 0;
  *(undefined8 *)((long)&(this->_domainConstants)._afterLast + 4) = 0x100000000;
  (this->_domainConstantsRev)._size = 0;
  (this->_domainConstantsRev)._deleted = 0;
  (this->_domainConstantsRev)._capacityIndex = 0;
  (this->_domainConstantsRev)._capacity = 0;
  *(undefined8 *)&(this->_domainConstantsRev)._nextExpansionOccupancy = 0;
  *(undefined8 *)((long)&(this->_domainConstantsRev)._entries + 4) = 0;
  *(undefined4 *)((long)&(this->_domainConstantsRev)._afterLast + 4) = 0;
  Lib::DArray<unsigned_int>::ensure
            (&this->f_offsets,
             (ulong)(*(long *)(DAT_00b521b0 + 0x68) - *(long *)(DAT_00b521b0 + 0x60)) >> 3 &
             0xffffffff);
  Lib::DArray<unsigned_int>::ensure
            (&this->p_offsets,
             (ulong)(*(long *)(DAT_00b521b0 + 0x88) - *(long *)(DAT_00b521b0 + 0x80)) >> 3 &
             0xffffffff);
  lVar4 = *(long *)(DAT_00b521b0 + 0x60);
  if ((*(long *)(DAT_00b521b0 + 0x68) - lVar4 & 0x7fffffff8U) == 0) {
    uVar6 = 2;
  }
  else {
    uVar5 = 1;
    lVar7 = 0;
    do {
      iVar1 = *(int *)(*(long *)(lVar4 + (long)(int)lVar7 * 8) + 0x20);
      (this->f_offsets)._array[lVar7] = uVar5;
      dVar3 = pow((double)size,(double)(iVar1 + 1));
      uVar5 = (int)(long)dVar3 + uVar5;
      lVar4 = *(long *)(DAT_00b521b0 + 0x60);
      lVar7 = lVar7 + 1;
    } while ((uint)lVar7 < (uint)((ulong)(*(long *)(DAT_00b521b0 + 0x68) - lVar4) >> 3));
    uVar6 = (ulong)(uVar5 + 1);
  }
  uVar2 = (this->f_interpretation)._size;
  Lib::DArray<unsigned_int>::expand(&this->f_interpretation,uVar6);
  if (uVar2 <= uVar6 && uVar6 - uVar2 != 0) {
    memset((this->f_interpretation)._array + uVar2,0,(uVar6 - uVar2) * 4);
  }
  lVar4 = *(long *)(DAT_00b521b0 + 0x80);
  if ((*(long *)(DAT_00b521b0 + 0x88) - lVar4 & 0x7fffffff0U) == 0) {
    uVar6 = 2;
  }
  else {
    uVar5 = 1;
    lVar7 = 1;
    do {
      iVar1 = *(int *)(*(long *)(lVar4 + (long)(int)lVar7 * 8) + 0x20);
      (this->p_offsets)._array[lVar7] = uVar5;
      dVar3 = pow((double)size,(double)(iVar1 + 1));
      uVar5 = (int)(long)dVar3 + uVar5;
      lVar4 = *(long *)(DAT_00b521b0 + 0x80);
      lVar7 = lVar7 + 1;
    } while ((uint)lVar7 < (uint)((ulong)(*(long *)(DAT_00b521b0 + 0x88) - lVar4) >> 3));
    uVar6 = (ulong)(uVar5 + 1);
  }
  uVar2 = (this->p_interpretation)._size;
  Lib::DArray<unsigned_int>::expand(&this->p_interpretation,uVar6);
  if (uVar2 <= uVar6 && uVar6 - uVar2 != 0) {
    memset((this->p_interpretation)._array + uVar2,0,(uVar6 - uVar2) * 4);
    return;
  }
  return;
}

Assistant:

FiniteModel::FiniteModel(unsigned size) : _size(size), _isPartial(false)
{
  (void)_isPartial; // to suppress unused warning

  f_offsets.ensure(env.signature->functions());
  p_offsets.ensure(env.signature->predicates());

  // generate offsets per function for indexing f_interpreation
  // see addFunctionDefinition for how the offset is used to compute
  // the actual index
  unsigned offsets=1;
  for(unsigned f=0; f<env.signature->functions(); f++){
    unsigned arity=env.signature->functionArity(f);
    f_offsets[f]=offsets;
    unsigned add = pow(size,arity+1);
    ASS(UINT_MAX - add > offsets);
    offsets += add;
  }
  f_interpretation.expand(offsets+1,0);
  // can restart for predicates as indexing p_interepration instead
  offsets=1;
  for(unsigned p=1; p<env.signature->predicates();p++){
    unsigned arity=env.signature->predicateArity(p);
    p_offsets[p]=offsets;
    unsigned add = pow(size,arity+1);
    ASS(UINT_MAX - add > offsets);
    offsets += add;
  }
  p_interpretation.expand(offsets+1,0);

}